

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRP.cpp
# Opt level: O1

void __thiscall GLRP::loadParser(GLRP *this)

{
  CFG *this_00;
  GLRParser *this_01;
  vector<Production_*,_std::allocator<Production_*>_> productionsP;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  terminalsT;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nonTerminalsV;
  string startS;
  vector<Production_*,_std::allocator<Production_*>_> local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string local_60;
  string local_40;
  
  if (this->loaded == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Creating CFG...",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"grammar/Simple Grammar/cpp.json","");
    readJson(&local_60,&local_78,&local_98,&local_b8,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    this_00 = (CFG *)operator_new(0x68);
    CFG::CFG(this_00,&local_78,&local_98,&local_b8,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Creating GLRParser...",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"This might take a while...",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Hint: The parser has to be created only once per runtime. Once generated, all feautures will work a lot faster."
               ,0x6f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    this_01 = (GLRParser *)operator_new(0xa8);
    GLRParser::GLRParser(this_01,this_00,false);
    this->glrParser = this_01;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    this->loaded = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
    if (local_b8.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<Production_*,_std::allocator<Production_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<Production_*,_std::allocator<Production_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<Production_*,_std::allocator<Production_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
  }
  return;
}

Assistant:

void GLRP::loadParser() {
    if (isLoaded())
        return;

    std::cout << "Creating CFG..." << std::endl;

    // Generate a CFG for the c++ language
    std::vector<std::string> nonTerminalsV;
    std::vector<std::string> terminalsT;
    std::vector<Production *> productionsP;
    std::string startS;

    readJson("grammar/Simple Grammar/cpp.json", nonTerminalsV, terminalsT, productionsP, startS);

    CFG *cfg = new CFG(nonTerminalsV, terminalsT, productionsP, startS);

    std::cout << "Creating GLRParser..." << std::endl;
    std::cout << "This might take a while..." << std::endl;
    std::cout << "Hint: The parser has to be created only once per runtime. Once generated, all feautures will work a lot faster." << std::endl;
    // Generate a GLRParser
    setGlrParser(new GLRParser(cfg, VERBOSE));

//    glrParser->toDot("output/GLRParser202500126.dot");

    std::cout << "Done" << std::endl;

    setLoaded(true);

}